

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntrusiveList.h
# Opt level: O3

void __thiscall
IntrusiveList<SynShortFunctionArgument>::push_back
          (IntrusiveList<SynShortFunctionArgument> *this,SynShortFunctionArgument *node)

{
  SynShortFunctionArgument **ppSVar1;
  bool bVar2;
  
  if (node == (SynShortFunctionArgument *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                  ,0xf,
                  "void IntrusiveList<SynShortFunctionArgument>::push_back(T *) [T = SynShortFunctionArgument]"
                 );
  }
  if ((node->super_SynBase).next == (SynBase *)0x0) {
    if ((node->super_SynBase).listed != true) {
      (node->super_SynBase).listed = true;
      bVar2 = this->head != (SynShortFunctionArgument *)0x0;
      ppSVar1 = (SynShortFunctionArgument **)&(this->tail->super_SynBase).next;
      if (!bVar2) {
        ppSVar1 = &this->tail;
      }
      *ppSVar1 = node;
      (&this->head)[bVar2] = node;
      return;
    }
    __assert_fail("!node->listed",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                  ,0x11,
                  "void IntrusiveList<SynShortFunctionArgument>::push_back(T *) [T = SynShortFunctionArgument]"
                 );
  }
  __assert_fail("node->next == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                ,0x10,
                "void IntrusiveList<SynShortFunctionArgument>::push_back(T *) [T = SynShortFunctionArgument]"
               );
}

Assistant:

void push_back(T *node)
	{
		assert(node);
		assert(node->next == 0);
		assert(!node->listed);

		node->listed = true;

		if(!head)
		{
			head = tail = node;
		}
		else
		{
			tail->next = node;
			tail = node;
		}
	}